

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O1

void pinger_on_connect(uv_connect_t *req,int status)

{
  int iVar1;
  uv_write_t *req_00;
  void *pvVar2;
  undefined8 *extraout_RDX;
  uint nbufs;
  uv_handle_type *handle;
  uv_stream_t *stream;
  char *base;
  pinger_t *pinger;
  long lVar3;
  uv_buf_t uVar4;
  pinger_t *ppStack_98;
  uv_buf_t auStack_90 [5];
  uv_connect_t *puStack_38;
  pinger_t *ppStack_30;
  
  stream = req->handle;
  pinger = (pinger_t *)stream->data;
  pinger_on_connect_count = pinger_on_connect_count + 1;
  if (status == 0) {
    iVar1 = uv_is_readable(stream);
    if (iVar1 != 1) goto LAB_00162209;
    stream = req->handle;
    iVar1 = uv_is_writable(stream);
    if (iVar1 == 1) {
      stream = req->handle;
      iVar1 = uv_is_closing((uv_handle_t *)stream);
      if (iVar1 == 0) {
        pinger_write_ping(pinger);
        uv_read_start(req->handle,alloc_cb,pinger_read_cb);
        return;
      }
      goto LAB_00162213;
    }
  }
  else {
    pinger_on_connect_cold_1();
LAB_00162209:
    pinger_on_connect_cold_2();
  }
  pinger_on_connect_cold_3();
LAB_00162213:
  pinger_on_connect_cold_4();
  puStack_38 = req;
  ppStack_30 = pinger;
  if (*(int *)&stream->data == 0) {
    ppStack_98 = (pinger_t *)0x162272;
    auStack_90[0] = uv_buf_init(PING,5);
    nbufs = 1;
  }
  else {
    base = PING;
    lVar3 = 8;
    do {
      ppStack_98 = (pinger_t *)0x162244;
      uVar4 = uv_buf_init(base,1);
      *(char **)((long)auStack_90 + lVar3 + -8) = uVar4.base;
      *(size_t *)((long)&auStack_90[0].base + lVar3) = uVar4.len;
      base = (char *)((long)&((pinger_t *)base)->vectored_writes + 1);
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x58);
    nbufs = 5;
    pinger = (pinger_t *)base;
  }
  ppStack_98 = (pinger_t *)0x16228a;
  req_00 = (uv_write_t *)malloc(0xc0);
  handle = &stream->type;
  ppStack_98 = (pinger_t *)0x1622a5;
  iVar1 = uv_write(req_00,(uv_stream_t *)handle,auStack_90,nbufs,pinger_after_write);
  if (iVar1 == 0) {
    ppStack_98 = (pinger_t *)0x1622b5;
    puts("PING");
    return;
  }
  ppStack_98 = (pinger_t *)alloc_cb;
  pinger_write_ping_cold_1();
  ppStack_98 = pinger;
  pvVar2 = malloc((size_t)handle);
  *extraout_RDX = pvVar2;
  extraout_RDX[1] = handle;
  return;
}

Assistant:

static void pinger_on_connect(uv_connect_t *req, int status) {
  pinger_t *pinger = (pinger_t*)req->handle->data;

  pinger_on_connect_count++;

  ASSERT(status == 0);

  ASSERT(1 == uv_is_readable(req->handle));
  ASSERT(1 == uv_is_writable(req->handle));
  ASSERT(0 == uv_is_closing((uv_handle_t *) req->handle));

  pinger_write_ping(pinger);

  uv_read_start((uv_stream_t*)(req->handle), alloc_cb, pinger_read_cb);
}